

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpMap<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ClassData *pCVar2;
  NodeBase *node_00;
  ParseContext *pPVar3;
  FieldAux *aux_00;
  TcParseTableBase *table_00;
  FieldEntry *entry_00;
  undefined4 *puVar4;
  UntypedMapBase *this;
  MapAuxInfo MVar5;
  TcParseTableBase *pTVar6;
  ParseContext *pPVar7;
  uint64_t uVar8;
  MessageLite *x;
  ushort uVar9;
  unsigned_short uVar10;
  uint32_t uVar11;
  CppType CVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  FieldEntry *entry_01;
  char *pcVar16;
  MapFieldBaseForParse *this_00;
  Arena *pAVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  LogMessage *pLVar19;
  int *piVar20;
  ulong uVar21;
  long lVar22;
  uint7 uVar25;
  long lVar23;
  uint *puVar24;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool bVar26;
  UntypedMapBase *local_420;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_408;
  ParseContext *local_400;
  char *ptr2;
  uint32_t next_tag;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_3e0;
  MapAuxInfo local_3d8;
  MapAuxInfo local_3d0;
  NodeBase **local_3c8;
  TcParseTableBase **local_3c0;
  MapAuxInfo *local_3b8;
  uint64_t *local_3b0;
  FieldEntry *local_3a8;
  UntypedMapBase *local_3a0;
  uint8_t local_392;
  uint8_t local_391;
  NodeBase *local_390;
  NodeBase *node;
  UntypedMapBase *pUStack_380;
  uint32_t saved_tag;
  UntypedMapBase *map;
  void *base;
  MapAuxInfo local_368;
  MapAuxInfo map_info;
  FieldAux *aux;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_318;
  TcFieldData local_310;
  undefined1 local_301;
  uint64_t uStack_300;
  bool always_return;
  TcParseTableBase *local_2f8;
  ParseContext *local_2f0;
  ParseContext *local_2e8;
  MessageLite *local_2e0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2c8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  uint64_t res;
  ParseContext *local_1c0;
  ulong uStack_130;
  int32_t sample;
  size_t pos;
  uint16_t num_ordered;
  uint16_t length_bitmap;
  uint64_t adjusted;
  uint16_t length_seq;
  int16_t min_seq;
  MapTypeCard local_e2;
  undefined1 local_e1;
  MapAuxInfo local_e0;
  UntypedMapBase *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  MapTypeCard local_c5;
  LimitToken local_c4;
  undefined1 local_c0 [16];
  LogMessageFatal local_b0 [23];
  Voidify local_99;
  string *local_98;
  string *absl_log_internal_check_op_result;
  undefined4 local_88;
  int old_depth;
  LimitToken local_74;
  NodeBase ***pppNStack_70;
  LimitToken old;
  ParseContext *local_58;
  undefined1 local_40 [12];
  int size;
  ParseContext *local_30;
  TcParseTableBase *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  NodeBase ***local_10;
  
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar11 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  entry_01 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar11);
  map_info = (MapAuxInfo)TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,entry_01);
  local_368 = *(MapAuxInfo *)map_info;
  bVar26 = true;
  if (((ulong)local_368 & 0x10000) != 0) {
    uVar11 = TcFieldData::tag((TcFieldData *)&msg_local);
    bVar26 = (uVar11 & 7) != 2;
  }
  if (bVar26) {
    base = msg_local;
    pcVar16 = MpFallback((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                         (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,hasbits);
    return pcVar16;
  }
  map = (UntypedMapBase *)
        MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
  if (((byte)local_368._2_1_ >> 1 & 1) == 0) {
    this_00 = RefAt<google::protobuf::internal::MapFieldBaseForParse>(map,(ulong)entry_01->offset);
    local_420 = MapFieldBaseForParse::MutableMap(this_00);
  }
  else {
    local_420 = RefAt<google::protobuf::internal::UntypedMapBase>(map,(ulong)entry_01->offset);
  }
  pUStack_380 = local_420;
  node._4_4_ = TcFieldData::tag((TcFieldData *)&msg_local);
  do {
    local_390 = UntypedMapBase::AllocNode(pUStack_380,local_368.node_size_info);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               NodeBase::GetVoidKey(local_390);
    local_391 = local_368.key_type_card.data_;
    local_c5.data_ = local_368.key_type_card.data_;
    local_d8 = pUStack_380;
    local_e0 = map_info;
    local_e1 = 1;
    CVar12 = MapTypeCard::cpp_type(&local_c5);
    pbVar18 = local_d0;
    switch(CVar12) {
    case kBool:
      memset(local_d0,0,1);
      break;
    case k32:
      memset(local_d0,0,4);
      break;
    case k64:
      memset(local_d0,0,8);
      break;
    case kString:
      pAVar17 = UntypedMapBase::arena(local_d8);
      Arena::CreateInArenaStorage<std::__cxx11::string>(pbVar18,pAVar17);
      break;
    case kMessage:
      pCVar2 = *(ClassData **)(*(long *)((long)local_e0 + 8) + 0x20);
      pAVar17 = UntypedMapBase::arena(local_d8);
      ClassData::PlacementNew(pCVar2,pbVar18,pAVar17);
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x9e9);
    }
    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              NodeBase::GetVoidValue(local_390,local_368.node_size_info);
    MVar5 = map_info;
    this = pUStack_380;
    local_392 = local_368.value_type_card.data_;
    local_e2.data_ = local_368.value_type_card.data_;
    CVar12 = MapTypeCard::cpp_type(&local_e2);
    switch(CVar12) {
    case kBool:
      memset(pbVar18,0,1);
      break;
    case k32:
      memset(pbVar18,0,4);
      break;
    case k64:
      memset(pbVar18,0,8);
      break;
    case kString:
      pAVar17 = UntypedMapBase::arena(this);
      Arena::CreateInArenaStorage<std::__cxx11::string>(pbVar18,pAVar17);
      break;
    case kMessage:
      pCVar2 = *(ClassData **)(*(long *)((long)MVar5 + 8) + 0x20);
      pAVar17 = UntypedMapBase::arena(this);
      ClassData::PlacementNew(pCVar2,pbVar18,pAVar17);
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x9e9);
    }
    pPVar7 = ctx_local;
    pTVar6 = table_local;
    local_3c8 = &local_390;
    local_3c0 = &table_local;
    local_3b8 = &map_info;
    local_3b0 = &hasbits_local;
    local_3a0 = pUStack_380;
    pppNStack_70 = &local_3c8;
    local_3a8 = entry_01;
    EpsCopyInputStream::LimitToken::LimitToken(&local_74);
    local_28 = pTVar6;
    local_30 = pPVar7;
    unique0x10000b71 = &local_74;
    local_40._4_4_ = ReadSize((char **)&local_30);
    if ((local_30 == (ParseContext *)0x0) || (*(int *)&pTVar6[1].class_data < 1)) {
      local_20 = (ParseContext *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_40,(char *)pTVar6,(int)local_30);
      EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffffc8,(LimitToken *)local_40);
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_40);
      *(int *)&pTVar6[1].class_data = *(int *)&pTVar6[1].class_data + -1;
      local_20 = local_30;
    }
    pPVar7 = local_20;
    if (local_20 == (ParseContext *)0x0) {
      local_58 = local_20;
    }
    else {
      absl_log_internal_check_op_result._4_4_ = *(int *)&pTVar6[1].class_data;
      local_10 = pppNStack_70;
      local_18 = local_20;
      node_00 = **pppNStack_70;
      pPVar3 = (ParseContext *)*pppNStack_70[1];
      aux_00 = (FieldAux *)*pppNStack_70[2];
      table_00 = (TcParseTableBase *)*pppNStack_70[3];
      entry_00 = (FieldEntry *)pppNStack_70[4];
      pAVar17 = UntypedMapBase::arena((UntypedMapBase *)pppNStack_70[5]);
      local_58 = (ParseContext *)
                 ParseOneMapEntry(node_00,(char *)pPVar7,pPVar3,aux_00,table_00,entry_00,pAVar17);
      if (local_58 != (ParseContext *)0x0) {
        iVar13 = absl::lts_20240722::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result._4_4_);
        iVar14 = absl::lts_20240722::log_internal::GetReferenceableValue
                           (*(int *)&pTVar6[1].class_data);
        local_98 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                             (iVar13,iVar14,"old_depth == depth_");
        if (local_98 != (string *)0x0) {
          local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,1099,local_c0._0_8_,local_c0._8_8_);
          pLVar19 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_b0);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_99,pLVar19);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
        }
        local_98 = (string *)0x0;
      }
      *(int *)&pTVar6[1].class_data = *(int *)&pTVar6[1].class_data + 1;
      EpsCopyInputStream::LimitToken::LimitToken(&local_c4,&local_74);
      bVar26 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)pTVar6,&local_c4);
      EpsCopyInputStream::LimitToken::~LimitToken(&local_c4);
      if (((bVar26 ^ 0xffU) & 1) != 0) {
        local_58 = (ParseContext *)0x0;
      }
    }
    local_88 = 1;
    EpsCopyInputStream::LimitToken::~LimitToken(&local_74);
    ctx_local = local_58;
    if (local_58 != (ParseContext *)0x0) {
      bVar26 = false;
      if (((byte)local_368._2_1_ >> 4 & 1) != 0) {
        piVar20 = (int *)NodeBase::GetVoidValue(local_390,local_368.node_size_info);
        iVar13 = *piVar20;
        puVar4 = *(undefined4 **)((long)map_info + 8);
        uVar9 = (ushort)((uint)*puVar4 >> 0x10);
        uVar21 = (long)iVar13 - (long)(short)*puVar4;
        if (uVar21 < uVar9) {
          bVar26 = true;
        }
        else {
          uVar21 = uVar21 - uVar9;
          if (uVar21 < (ushort)puVar4[1]) {
            bVar26 = ((uint)puVar4[(uVar21 >> 5) + 2] >> ((byte)uVar21 & 0x1f) & 1) == 1;
          }
          else {
            for (uStack_130 = 0; uStack_130 < (ushort)((uint)puVar4[1] >> 0x10);
                uStack_130 = uStack_130 * 2 + (long)iVar14) {
              if (puVar4[(long)(int)((puVar4[1] & 0xffff) / 0x20 + 2) + uStack_130] == iVar13) {
                bVar26 = true;
                goto LAB_0043d7fe;
              }
              iVar14 = 2;
              if (iVar13 < (int)puVar4[(long)(int)((puVar4[1] & 0xffff) / 0x20 + 2) + uStack_130]) {
                iVar14 = 1;
              }
            }
            bVar26 = false;
          }
        }
LAB_0043d7fe:
        bVar26 = (bool)(bVar26 ^ 1);
      }
      if (bVar26) {
        local_3d0 = local_368;
        WriteMapEntryAsUnknown
                  ((MessageLite *)ptr_local,(TcParseTableBase *)hasbits_local,node._4_4_,local_390,
                   local_368);
      }
      else {
        CVar12 = MapTypeCard::cpp_type(&local_368.key_type_card);
        switch(CVar12) {
        case kBool:
          local_390 = &KeyMapBase<bool>::InsertOrReplaceNode
                                 ((KeyMapBase<bool> *)pUStack_380,(KeyNode *)local_390)->
                       super_NodeBase;
          break;
        case k32:
          local_390 = &KeyMapBase<unsigned_int>::InsertOrReplaceNode
                                 ((KeyMapBase<unsigned_int> *)pUStack_380,(KeyNode *)local_390)->
                       super_NodeBase;
          break;
        case k64:
          local_390 = &KeyMapBase<unsigned_long>::InsertOrReplaceNode
                                 ((KeyMapBase<unsigned_long> *)pUStack_380,(KeyNode *)local_390)->
                       super_NodeBase;
          break;
        case kString:
          local_390 = &KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::InsertOrReplaceNode
                                 ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pUStack_380,(KeyNode *)local_390)->super_NodeBase;
          break;
        default:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xab6);
        }
      }
    }
    bVar26 = false;
    if (local_390 != (NodeBase *)0x0) {
      pAVar17 = UntypedMapBase::arena(pUStack_380);
      bVar26 = pAVar17 == (Arena *)0x0;
    }
    if (bVar26) {
      local_3d8 = local_368;
      DestroyMapNode(local_390,local_368,pUStack_380);
    }
    pcVar16 = ptr_local;
    pTVar6 = table_local;
    if (ctx_local == (ParseContext *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_3e0);
      pcVar16 = Error((MessageLite *)pcVar16,(char *)0x0,(ParseContext *)pTVar6,
                      (TcFieldData)local_3e0,(TcParseTableBase *)hasbits_local,hasbits);
      return pcVar16;
    }
    bVar26 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local);
    local_2e0 = (MessageLite *)ptr_local;
    pPVar7 = ctx_local;
    pTVar6 = table_local;
    if (((bVar26 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData((TcFieldData *)&next_tag);
      if (*(ushort *)hasbits_local != 0) {
        puVar24 = RefAt<unsigned_int>(local_2e0,(ulong)(uint)*(ushort *)hasbits_local);
        *puVar24 = (uint)hasbits | *puVar24;
      }
      return (char *)pPVar7;
    }
    ptr2._0_4_ = (uint)*(byte *)&(ctx_local->super_EpsCopyInputStream).limit_end_;
    if ((ulong)(long)(int)(uint)ptr2 < 0x80) {
      local_1c0 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
    }
    else {
      lVar23 = (long)(int)(uint)ptr2 << 0x39;
      uVar25 = (uint7)((ulong)lVar23 >> 8);
      bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
      lVar22 = CONCAT71(uVar25,bVar1);
      if ((bVar1 & 0x80) == 0) {
        ptr2._0_4_ = (int)lVar22 << 7 | (uint)((ulong)lVar23 >> 0x39);
        local_1c0 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
      }
      else {
        uVar25 = uVar25 >> 7 | (uint7)((ulong)(lVar22 << 0x39) >> 8);
        bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
        lVar23 = CONCAT71(uVar25,bVar1);
        if ((bVar1 & 0x80) == 0) {
          ptr2._0_4_ = (int)lVar23 << 0xe | (uint)(uVar25 >> 0x2a);
          local_1c0 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 3);
        }
        else {
          uVar25 = uVar25 >> 7 | (uint7)((ulong)(lVar23 << 0x39) >> 8);
          bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 3);
          lVar23 = CONCAT71(uVar25,bVar1);
          if ((bVar1 & 0x80) == 0) {
            ptr2._0_4_ = (int)lVar23 << 0x15 | (uint)(uVar25 >> 0x23);
            local_1c0 = (ParseContext *)
                        ((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
          }
          else {
            uVar25 = uVar25 >> 7 | (uint7)((ulong)(lVar23 << 0x39) >> 8);
            bVar1 = *(byte *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
            if ((bVar1 & 0x80) == 0) {
              ptr2._0_4_ = (int)CONCAT71(uVar25,bVar1) << 0x1c | (uint)(uVar25 >> 0x1c);
              local_1c0 = (ParseContext *)
                          ((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 5);
            }
            else {
              ptr2._0_4_ = 0;
              local_1c0 = (ParseContext *)0x0;
            }
          }
        }
      }
    }
    local_400 = local_1c0;
    if ((uint)ptr2 != node._4_4_) {
      TcFieldData::TcFieldData((TcFieldData *)&local_408);
      local_2d8 = local_408;
      local_2e8 = pPVar7;
      local_2f0 = (ParseContext *)pTVar6;
      local_2f8 = (TcParseTableBase *)hasbits_local;
      local_301 = 0;
      uStack_300 = hasbits;
      bVar26 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar6,(char *)pPVar7);
      x = local_2e0;
      pPVar3 = local_2e8;
      pPVar7 = local_2f0;
      if (!bVar26) {
        TcFieldData::TcFieldData(&local_310);
        if (local_2f8->has_bits_offset != 0) {
          uVar15 = (uint)uStack_300;
          puVar24 = RefAt<unsigned_int>(x,(ulong)(uint)local_2f8->has_bits_offset);
          *puVar24 = uVar15 | *puVar24;
        }
        return (char *)pPVar3;
      }
      TcFieldData::TcFieldData(&local_318);
      pTVar6 = local_2f8;
      uVar8 = uStack_300;
      uVar10 = UnalignedLoad<unsigned_short>((char *)pPVar3);
      uVar21 = (ulong)(int)((uint)uVar10 & (uint)pTVar6->fast_idx_mask);
      if ((uVar21 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar6,uVar21 >> 3);
        local_2c8.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar10;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_2d0.data = local_2c8.data;
        pcVar16 = (*UNRECOVERED_JUMPTABLE)
                            (x,(char *)pPVar3,pPVar7,(TcFieldData)local_2c8,pTVar6,uVar8);
        return pcVar16;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    ctx_local = local_1c0;
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (PROTOBUF_PREDICT_FALSE(!map_info.is_supported ||
                             (data.tag() & 7) !=
                                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode(map_info.node_size_info);

    InitializeMapNodeEntry(node->GetVoidKey(), map_info.key_type_card, map, aux,
                           true);
    InitializeMapNodeEntry(node->GetVoidValue(map_info.node_size_info),
                           map_info.value_type_card, map, aux, false);

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map.arena());
    });

    if (PROTOBUF_PREDICT_TRUE(ptr != nullptr)) {
      if (PROTOBUF_PREDICT_FALSE(map_info.value_is_validated_enum &&
                                 !internal::ValidateEnumInlined(
                                     *static_cast<int32_t*>(node->GetVoidValue(
                                         map_info.node_size_info)),
                                     aux[1].enum_data))) {
        WriteMapEntryAsUnknown(msg, table, saved_tag, node, map_info);
      } else {
        // Done parsing the node, try to insert it.
        // If it overwrites something we get old node back to destroy it.
        switch (map_info.key_type_card.cpp_type()) {
          case MapTypeCard::kBool:
            node = static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<bool>::KeyNode*>(node));
            break;
          case MapTypeCard::k32:
            node = static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
            break;
          case MapTypeCard::k64:
            node = static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
            break;
          case MapTypeCard::kString:
            node =
                static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
                    static_cast<KeyMapBase<std::string>::KeyNode*>(node));
            break;
          default:
            Unreachable();
        }
      }
    }

    // Destroy the node if we have it.
    // It could be because we failed to parse, or because insertion returned
    // an overwritten node.
    if (PROTOBUF_PREDICT_FALSE(node != nullptr && map.arena() == nullptr)) {
      DestroyMapNode(node, map_info, map);
    }

    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}